

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

size_t path_length(__va_list_tag *va_path)

{
  long *local_50;
  undefined8 uStack_38;
  va_list path_copy;
  size_t local_18;
  size_t i;
  __va_list_tag *va_path_local;
  
  local_18 = 0;
  uStack_38._0_4_ = va_path->gp_offset;
  uStack_38._4_4_ = va_path->fp_offset;
  path_copy[0]._0_8_ = va_path->overflow_arg_area;
  while( true ) {
    if ((uint)uStack_38 < 0x29) {
      local_50 = (long *)((long)(int)(uint)uStack_38 + (long)va_path->reg_save_area);
      uStack_38._0_4_ = (uint)uStack_38 + 8;
    }
    else {
      local_50 = (long *)path_copy[0]._0_8_;
      path_copy[0]._0_8_ = path_copy[0]._0_8_ + 8;
    }
    if (*local_50 == 0) break;
    local_18 = local_18 + 1;
  }
  return local_18;
}

Assistant:

static size_t path_length(va_list va_path) {
    size_t i = 0;
    va_list path_copy;
    va_copy(path_copy, va_path);

    while (NULL != va_arg(path_copy, char *)) {
        i++;
    }

    va_end(path_copy);

    return i;
}